

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

optional<long_long> anon_unknown.dwarf_89ecae::qConvertToNumber(Private *d,bool allowStringToBool)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined7 extraout_var;
  undefined8 unaff_RBP;
  undefined7 uVar5;
  Private *this;
  long in_FS_OFFSET;
  optional<long_long> oVar6;
  _Storage<long_long,_true> _Stack_60;
  QLatin1StringView local_50;
  QLatin1StringView local_40;
  bool ok;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  ok = true;
  iVar3 = *(int *)((*(ulong *)&d->field_0x18 & 0xfffffffffffffffc) + 0xc);
  uVar5 = (undefined7)((ulong)unaff_RBP >> 8);
  switch(iVar3) {
  case 1:
    if ((d->field_0x18 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    _Stack_60._M_value._1_7_ = 0;
    _Stack_60._M_value._0_1_ = (d->data).data[0];
    break;
  case 7:
    if ((d->field_0x18 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    _Stack_60._M_value._2_6_ = 0;
    _Stack_60._M_value._0_2_ = *(ushort *)&d->data;
    break;
  case 8:
  case 9:
  case 0xb:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x27:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
switchD_002a541e_caseD_8:
    uVar4 = *(ulong *)&d->field_0x18 & 0xfffffffffffffffc;
    if (((*(byte *)(uVar4 + 8) & 0x10) == 0) &&
       (uVar1 = *(uint *)(uVar4 + 0xc), _Stack_60._M_value._4_4_ = 0,
       _Stack_60._M_value._0_4_ = uVar1, uVar1 != 0x34)) goto LAB_002a560c;
    _Stack_60._M_value = qMetaTypeNumberBySize(d);
    break;
  case 10:
    if ((d->field_0x18 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    _Stack_60._M_value = QString::toLongLong((QString *)d,&ok,10);
    uVar4 = CONCAT71(uVar5,1);
    if (ok != false) goto LAB_002a543e;
    if (allowStringToBool) {
      local_40.m_size = 5;
      local_40.m_data = "false";
      bVar2 = ::operator==((QString *)d,&local_40);
      if (!bVar2) {
        local_50.m_size = 1;
        local_50.m_data = "0";
        bVar2 = ::operator==((QString *)d,&local_50);
        if (!bVar2) {
          local_40.m_size = 4;
          local_40.m_data = "true";
          bVar2 = ::operator==((QString *)d,&local_40);
          if (!bVar2) {
            local_50.m_size = 1;
            local_50.m_data = "1";
            _Stack_60._M_value._0_1_ = ::operator==((QString *)d,&local_50);
            _Stack_60._M_value._1_7_ = extraout_var;
            if (!(bool)_Stack_60._M_value._0_1_) goto LAB_002a560c;
          }
          _Stack_60._M_value = 1;
          goto LAB_002a543e;
        }
      }
      _Stack_60._M_value = 0;
      goto LAB_002a543e;
    }
LAB_002a560c:
    uVar4 = 0;
    goto LAB_002a543e;
  case 0xc:
    if ((d->field_0x18 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    _Stack_60._M_value = QByteArray::toLongLong((QByteArray *)d,&ok,10);
    uVar4 = CONCAT71(uVar5,ok);
    goto LAB_002a543e;
  case 0x2d:
    this = d;
    if ((d->field_0x18 & 1) != 0) {
      this = (Private *)
             ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
             (long)((d->data).shared)->offset);
    }
    bVar2 = QJsonValue::isDouble((QJsonValue *)this);
    if (!bVar2) goto switchD_002a541e_caseD_8;
  case 2:
  case 4:
  case 6:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x26:
  case 0x28:
switchD_002a541e_caseD_2:
    _Stack_60._M_value = qMetaTypeNumber(d);
    break;
  default:
    if (1 < iVar3 - 0x38U) {
      if (iVar3 == 0x35) {
        if ((d->field_0x18 & 1) == 0) {
          iVar3 = *(int *)((long)&d->data + 0x10);
        }
        else {
          iVar3 = *(int *)((long)&(d->data).shared[2].ref.super_QAtomicInteger<int>.
                                  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
                                  _M_i + (long)((d->data).shared)->offset);
        }
        if ((iVar3 == 0) || (iVar3 == 0x202)) goto switchD_002a541e_caseD_2;
      }
      goto switchD_002a541e_caseD_8;
    }
  case 3:
  case 5:
  case 0x23:
  case 0x24:
  case 0x25:
    _Stack_60._M_value = qMetaTypeUNumber(d);
  }
  uVar4 = CONCAT71(uVar5,1);
LAB_002a543e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  oVar6.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._8_8_ = uVar4 & 0xffffffff;
  oVar6.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_payload._M_value = _Stack_60._M_value;
  return (optional<long_long>)
         oVar6.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>;
}

Assistant:

static std::optional<qlonglong> qConvertToNumber(const QVariant::Private *d, bool allowStringToBool = false)
{
    bool ok;
    switch (d->typeInterface()->typeId) {
    case QMetaType::QString: {
        const QString &s = d->get<QString>();
        if (qlonglong l = s.toLongLong(&ok); ok)
            return l;
        if (allowStringToBool) {
            if (s == "false"_L1 || s == "0"_L1)
                return 0;
            if (s == "true"_L1 || s == "1"_L1)
                return 1;
        }
        return std::nullopt;
    }
    case QMetaType::QChar:
        return d->get<QChar>().unicode();
    case QMetaType::QByteArray:
        if (qlonglong l = d->get<QByteArray>().toLongLong(&ok); ok)
            return l;
        return std::nullopt;
    case QMetaType::Bool:
        return qlonglong(d->get<bool>());
    case QMetaType::QCborValue:
        if (!d->get<QCborValue>().isInteger() && !d->get<QCborValue>().isDouble())
            break;
        return qMetaTypeNumber(d);
    case QMetaType::QJsonValue:
        if (!d->get<QJsonValue>().isDouble())
            break;
        Q_FALLTHROUGH();
    case QMetaType::Double:
    case QMetaType::Int:
    case QMetaType::Char:
    case QMetaType::SChar:
    case QMetaType::Short:
    case QMetaType::Long:
    case QMetaType::Float:
    case QMetaType::LongLong:
        return qMetaTypeNumber(d);
    case QMetaType::ULongLong:
    case QMetaType::UInt:
    case QMetaType::UChar:
    case QMetaType::Char16:
    case QMetaType::Char32:
    case QMetaType::UShort:
    case QMetaType::ULong:
        return qlonglong(qMetaTypeUNumber(d));
    }

    if (d->typeInterface()->flags & QMetaType::IsEnumeration
        || d->typeInterface()->typeId == QMetaType::QCborSimpleType)
        return qMetaTypeNumberBySize(d);

    return std::nullopt;
}